

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O1

char * absl::lts_20250127::anon_unknown_1::Format64(char *ep,int width,int64_t v)

{
  ulong uVar1;
  char *__s;
  long lVar2;
  uint uVar3;
  
  uVar3 = width - 1;
  lVar2 = 0;
  do {
    ep[lVar2 + -1] = (char)v + (char)(v / 10) * -10 + '0';
    uVar1 = v + 9;
    lVar2 = lVar2 + -1;
    uVar3 = uVar3 - 1;
    v = v / 10;
  } while (0x12 < uVar1);
  if ((int)((ulong)(uint)width + lVar2) + 1 < 2) {
    __s = ep + lVar2;
  }
  else {
    __s = ep + (lVar2 - (ulong)uVar3) + -1;
    memset(__s,0x30,(ulong)(uint)width + lVar2 & 0xffffffff);
  }
  return __s;
}

Assistant:

char* Format64(char* ep, int width, int64_t v) {
  do {
    --width;
    *--ep = static_cast<char>('0' + (v % 10));  // contiguous digits
  } while (v /= 10);
  while (--width >= 0) *--ep = '0';  // zero pad
  return ep;
}